

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

void nn_node_dump(nn_trie_node *self,int indent)

{
  uint local_1c;
  uint local_18;
  int children;
  int i;
  int indent_local;
  nn_trie_node *self_local;
  
  if (self == (nn_trie_node *)0x0) {
    nn_node_indent(indent);
    printf("NULL\n");
  }
  else {
    nn_node_indent(indent);
    printf("===================\n");
    nn_node_indent(indent);
    printf("refcount=%d\n",(ulong)self->refcount);
    nn_node_indent(indent);
    printf("prefix_len=%d\n",(ulong)self->prefix_len);
    nn_node_indent(indent);
    if (self->type == '\t') {
      printf("type=dense\n");
    }
    else {
      printf("type=sparse\n");
    }
    nn_node_indent(indent);
    printf("prefix=\"");
    for (local_18 = 0; local_18 != self->prefix_len; local_18 = local_18 + 1) {
      nn_node_putchar(self->prefix[(int)local_18]);
    }
    printf("\"\n");
    if (self->type < 9) {
      nn_node_indent(indent);
      printf("sparse.children=\"");
      for (local_18 = 0; local_18 != self->type; local_18 = local_18 + 1) {
        nn_node_putchar(self->prefix[(long)(int)local_18 + 10]);
      }
      printf("\"\n");
      local_1c = (uint)self->type;
    }
    else {
      nn_node_indent(indent);
      printf("dense.min=\'%c\' (%d)\n",(ulong)(uint)(int)(char)(self->u).sparse.children[0],
             (ulong)(self->u).sparse.children[0]);
      nn_node_indent(indent);
      printf("dense.max=\'%c\' (%d)\n",(ulong)(uint)(int)(char)(self->u).sparse.children[1],
             (ulong)(self->u).sparse.children[1]);
      nn_node_indent(indent);
      printf("dense.nbr=%d\n",(ulong)(self->u).dense.nbr);
      local_1c = ((uint)(self->u).sparse.children[1] - (uint)(self->u).sparse.children[0]) + 1;
    }
    for (local_18 = 0; local_18 != local_1c; local_18 = local_18 + 1) {
      nn_node_dump(*(nn_trie_node **)(self[1].prefix + (long)(int)local_18 * 8 + -6),indent + 1);
    }
    nn_node_indent(indent);
    printf("===================\n");
  }
  return;
}

Assistant:

void nn_node_dump (struct nn_trie_node *self, int indent)
{
    int i;
    int children;

    if (!self) {
        nn_node_indent (indent);
        printf ("NULL\n");
        return;
    }

    nn_node_indent (indent);
    printf ("===================\n");
    nn_node_indent (indent);
    printf ("refcount=%d\n", (int) self->refcount);
    nn_node_indent (indent);
    printf ("prefix_len=%d\n", (int) self->prefix_len);
    nn_node_indent (indent);
    if (self->type == NN_TRIE_DENSE_TYPE)
        printf ("type=dense\n");
    else
        printf ("type=sparse\n");
    nn_node_indent (indent);
    printf ("prefix=\"");
    for (i = 0; i != self->prefix_len; ++i)
        nn_node_putchar (self->prefix [i]);
    printf ("\"\n");
    if (self->type <= 8) {
        nn_node_indent (indent);
        printf ("sparse.children=\"");
        for (i = 0; i != self->type; ++i)
            nn_node_putchar (self->u.sparse.children [i]);
        printf ("\"\n");
        children = self->type;
    }
    else {
        nn_node_indent (indent);
        printf ("dense.min='%c' (%d)\n", (char) self->u.dense.min,
            (int) self->u.dense.min);
        nn_node_indent (indent);
        printf ("dense.max='%c' (%d)\n", (char) self->u.dense.max,
            (int) self->u.dense.max);
        nn_node_indent (indent);
        printf ("dense.nbr=%d\n", (int) self->u.dense.nbr);
        children = self->u.dense.max - self->u.dense.min + 1;
    }

    for (i = 0; i != children; ++i)
        nn_node_dump (((struct nn_trie_node**) (self + 1)) [i], indent + 1);

    nn_node_indent (indent);
    printf ("===================\n");
}